

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_Utf16HighWithMissingLowSurrogate_Test::JsonString_Utf16HighWithMissingLowSurrogate_Test
          (JsonString_Utf16HighWithMissingLowSurrogate_Test *this)

{
  JsonString_Utf16HighWithMissingLowSurrogate_Test *this_local;
  
  anon_unknown.dwarf_1403f7::JsonString::JsonString(&this->super_JsonString);
  (this->super_JsonString).super_Test._vptr_Test =
       (_func_int **)&PTR__JsonString_Utf16HighWithMissingLowSurrogate_Test_0025c098;
  return;
}

Assistant:

TEST_F (JsonString, Utf16HighWithMissingLowSurrogate) {
    // Encoding for MUSICAL SYMBOL G CLEF (U+1D11E) expressed as a UTF-16
    // surrogate pair.
    auto p = json::make_parser (proxy_);
    p.input (R"("\uDD1E\u30A1")").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::bad_unicode_code_point));
    EXPECT_EQ (p.coordinate (), (json::coord{7U, 1U}));
}